

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_diag_m(REF_DBL *m,REF_DBL *d)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  REF_DBL *pRVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  REF_DBL RVar24;
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  double local_60;
  REF_DBL local_58 [4];
  double local_38;
  undefined8 uStack_30;
  
  RVar24 = *m;
  if (0x7fefffffffffffff < (ulong)ABS(RVar24)) {
    return 3;
  }
  dVar22 = m[1];
  if (0x7fefffffffffffff < (ulong)ABS(dVar22)) {
    return 3;
  }
  dVar21 = m[2];
  if (0x7fefffffffffffff < (ulong)ABS(dVar21)) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[3])) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[4])) {
    return 3;
  }
  if (0x7fefffffffffffff < (ulong)ABS(m[5])) {
    return 3;
  }
  local_58[0] = SQRT(dVar22 * dVar22 + dVar21 * dVar21);
  auVar19._0_8_ = local_58[0] * 1e+20;
  auVar19._8_8_ = dVar22;
  auVar20._8_8_ = -dVar22;
  auVar20._0_8_ = -auVar19._0_8_;
  auVar20 = maxpd(auVar19,auVar20);
  if (auVar20._8_8_ < auVar20._0_8_) {
    dVar16 = dVar21;
    if (dVar21 <= -dVar21) {
      dVar16 = -dVar21;
    }
    if (dVar16 < auVar20._0_8_) {
      auVar13._8_8_ = dVar21;
      auVar13._0_8_ = dVar22;
      auVar18._8_8_ = local_58[0];
      auVar18._0_8_ = local_58[0];
      auVar20 = divpd(auVar13,auVar18);
      dVar22 = auVar20._0_8_;
      dVar21 = auVar20._8_8_;
      dVar17 = (dVar22 + dVar22) * m[4] + (m[5] - m[3]) * dVar21;
      *d = RVar24;
      dVar16 = dVar21 * dVar17;
      d[1] = m[3] + dVar16;
      d[2] = m[5] - dVar16;
      d[3] = 1.0;
      d[4] = 0.0;
      d[5] = 0.0;
      d[6] = 0.0;
      *(undefined1 (*) [16])(d + 7) = auVar20;
      d[9] = 0.0;
      d[10] = dVar21;
      d[0xb] = -dVar22;
      local_58[1] = m[4] - dVar17 * dVar22;
      goto LAB_0017df0b;
    }
  }
  *d = RVar24;
  d[1] = m[3];
  d[2] = m[5];
  d[3] = 1.0;
  d[4] = 0.0;
  d[5] = 0.0;
  d[6] = 0.0;
  d[7] = 1.0;
  d[8] = 0.0;
  d[9] = 0.0;
  d[10] = 0.0;
  d[0xb] = 1.0;
  local_58[0] = m[1];
  local_58[1] = m[4];
LAB_0017df0b:
  local_58[2] = 0.0;
  iVar5 = 0;
  dVar22 = 0.0;
  local_60 = 0.0;
  dVar21 = 0.0;
  local_38 = 0.0;
  uVar7 = 0;
  do {
    dVar16 = d[uVar7];
    dVar17 = dVar16;
    if (dVar16 <= -dVar16) {
      dVar17 = -dVar16;
    }
    RVar24 = local_58[uVar7];
    dVar23 = RVar24;
    if (RVar24 <= -RVar24) {
      dVar23 = -RVar24;
    }
    uVar8 = uVar7;
    dVar14 = dVar23 + dVar17;
    if (dVar23 + dVar17 <= local_38) {
      dVar14 = local_38;
    }
    do {
      local_38 = dVar14;
      dVar17 = local_58[uVar8];
      if (dVar17 <= -dVar17) {
        dVar17 = -dVar17;
      }
      dVar17 = (dVar17 + local_38) - local_38;
      if (dVar17 <= -dVar17) {
        dVar17 = -dVar17;
      }
      if (dVar17 < 1e-14) goto LAB_0017dfe0;
      uVar8 = uVar8 + 1;
      dVar14 = local_38;
    } while (uVar8 != 3);
    uVar8 = 3;
LAB_0017dfe0:
    uVar1 = uVar7 + 1;
    if (uVar7 != (uVar8 & 0xffffffff)) {
      iVar9 = (int)uVar8;
      iVar6 = 0;
      uStack_30 = 0;
      do {
        if (iVar6 == 0x1e) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
                 200,"ref_matrix_diag_m",1,"not converged");
          return 1;
        }
        dVar23 = (d[uVar1] - dVar16) / (RVar24 + RVar24);
        dVar17 = SQRT(dVar23 * dVar23 + 1.0);
        uVar12 = -(ulong)(0.0 < dVar17);
        if (0.0 <= dVar23) {
          dVar17 = (double)(~uVar12 & (ulong)-dVar17 | (ulong)dVar17 & uVar12);
        }
        else {
          dVar17 = (double)(~uVar12 & (ulong)dVar17 | (ulong)-dVar17 & uVar12);
        }
        dVar14 = RVar24 / (dVar23 + dVar17);
        d[uVar7] = dVar14;
        dVar17 = (dVar23 + dVar17) * RVar24;
        d[uVar1] = dVar17;
        dVar16 = dVar16 - dVar14;
        if (uVar7 == 0) {
          d[2] = d[2] - dVar16;
        }
        dVar23 = local_58[uVar1];
        auVar20 = ZEXT816(0x3ff0000000000000);
        if ((int)uVar7 < iVar9) {
          RVar24 = d[uVar8 & 0xffffffff];
          uVar12 = 0;
          auVar20 = ZEXT816(0x3ff0000000000000);
          pRVar11 = d + (long)iVar9 * 3 + 3;
          dVar14 = 1.0;
          dVar27 = 0.0;
          do {
            dVar22 = dVar27;
            dVar21 = dVar14;
            lVar10 = (long)iVar9 - uVar12;
            dVar2 = local_58[lVar10 + -1];
            dVar14 = auVar20._0_8_;
            auVar15._0_8_ = SQRT(RVar24 * RVar24 + dVar2 * dVar2);
            local_58[lVar10] = dVar22 * auVar15._0_8_;
            auVar15._8_8_ = auVar15._0_8_;
            auVar26._8_8_ = dVar2;
            auVar26._0_8_ = RVar24;
            auVar20 = divpd(auVar26,auVar15);
            dVar3 = d[lVar10 + -1];
            dVar25 = auVar20._0_8_;
            dVar27 = auVar20._8_8_;
            d[lVar10] = (dVar14 * dVar2 * dVar25 + dVar3 * dVar27) * dVar27 + RVar24 * dVar14;
            lVar10 = -3;
            do {
              dVar4 = pRVar11[lVar10 + 3];
              pRVar11[lVar10 + 3] = dVar27 * pRVar11[lVar10] + dVar25 * dVar4;
              pRVar11[lVar10] = pRVar11[lVar10] * dVar25 + dVar4 * -dVar27;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0);
            RVar24 = dVar3 * dVar25 + -dVar27 * dVar14 * dVar2;
            uVar12 = uVar12 + 1;
            pRVar11 = pRVar11 + -3;
          } while (uVar12 != (uint)(iVar9 + iVar5));
          RVar24 = local_58[uVar7];
        }
        iVar6 = iVar6 + 1;
        local_60 = local_60 + dVar16;
        dVar17 = (dVar23 * -auVar20._8_8_ * dVar22 * dVar21 * RVar24) / dVar17;
        RVar24 = auVar20._8_8_ * dVar17;
        local_58[uVar7] = RVar24;
        dVar16 = dVar17 * auVar20._0_8_;
        d[uVar7] = dVar16;
        dVar17 = RVar24;
        if (RVar24 <= -RVar24) {
          dVar17 = -RVar24;
        }
        dVar17 = (dVar17 + local_38) - local_38;
        if (dVar17 <= -dVar17) {
          dVar17 = -dVar17;
        }
      } while (1e-14 <= dVar17);
    }
    d[uVar7] = dVar16 + local_60;
    iVar5 = iVar5 + -1;
    uVar7 = uVar1;
    if (uVar1 == 3) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_matrix_diag_m(REF_DBL *m, REF_DBL *d) {
  REF_DBL L, u, v, s;
  REF_DBL e[3];

  REF_DBL f, tst1, tst2;
  REF_INT i, j, l, mm;
  REF_INT l1, l2;
  REF_DBL h, g, p, r, dl1;
  REF_DBL c, c2, c3, el1;
  REF_INT mml, ii, k;
  REF_DBL s2;

  /* potential for stack corruption, if inf or nan */
  if (!isfinite(m[0]) || !isfinite(m[1]) || !isfinite(m[2]) ||
      !isfinite(m[3]) || !isfinite(m[4]) || !isfinite(m[5])) {
    return REF_INVALID;
  }

  /* one rotation to make tridiagonal ( zero out m[2] ) */
  /* http://www.geometrictools.com/Documentation/EigenSymmetricNxN.pdf */
  /* Eigen System Solvers for Symmetric Matrices, David Eberly */

  L = sqrt(m[1] * m[1] + m[2] * m[2]);

  if (ref_math_divisible(m[1], L) && ref_math_divisible(m[2], L)) {
    u = m[1] / L;
    v = m[2] / L;
    s = 2.0 * u * m[4] + v * (m[5] - m[3]);

    ref_matrix_eig(d, 0) = m[0];
    ref_matrix_eig(d, 1) = m[3] + v * s;
    ref_matrix_eig(d, 2) = m[5] - v * s;

    ref_matrix_vec(d, 0, 0) = 1.0;
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = 0.0;

    ref_matrix_vec(d, 0, 1) = 0.0;
    ref_matrix_vec(d, 1, 1) = u;
    ref_matrix_vec(d, 2, 1) = v;

    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = v;
    ref_matrix_vec(d, 2, 2) = -u;

    e[0] = L;
    e[1] = m[4] - u * s;
    e[2] = 0.0;
  } else {
    ref_matrix_eig(d, 0) = m[0];
    ref_matrix_eig(d, 1) = m[3];
    ref_matrix_eig(d, 2) = m[5];

    ref_matrix_vec(d, 0, 0) = 1.0;
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = 0.0;

    ref_matrix_vec(d, 0, 1) = 0.0;
    ref_matrix_vec(d, 1, 1) = 1.0;
    ref_matrix_vec(d, 2, 1) = 0.0;

    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 0.0;
    ref_matrix_vec(d, 2, 2) = 1.0;

    e[0] = m[1];
    e[1] = m[4];
    e[2] = 0.0;
  }

  c3 = 0;
  s2 = 0; /* quiet -Wall used without set compiler warning */

  f = 0.0;
  tst1 = 0.0;
  e[2] = 0.0;

#define gridSign(a, b) (b >= 0 ? ABS(a) : -ABS(a))

  for (l = 0; l < 3; l++) { /* row_loop  */
    j = 0;
    h = ABS(d[l]) + ABS(e[l]);
    if (tst1 < h) tst1 = h;
    /* look for small sub-diagonal element */
    for (mm = l; mm < 3; mm++) { /*test_for_zero_e */
      tst2 = tst1 + ABS(e[mm]);
      if (ABS(tst2 - tst1) < 1.0e-14) break;
      /* e[2] is always zero, so there is no exit through the bottom of loop*/
    }
    if (mm != l) { /* l_not_equal_mm */
      do {
        j = j + 1;
        /* set error -- no convergence to an eigenvalue after 30 iterations */
        if (j > 30) {
          RSS(REF_FAILURE, "not converged");
        }
        /* form shift */
        l1 = l + 1;
        l2 = l1 + 1;
        g = d[l];
        p = (d[l1] - g) / (2.0 * e[l]);
        r = sqrt(p * p + 1.0);
        d[l] = e[l] / (p + gridSign(r, p));
        d[l1] = e[l] * (p + gridSign(r, p));
        dl1 = d[l1];
        h = g - d[l];
        if (l2 <= 2) {
          for (i = l2; i < 3; i++) {
            d[i] = d[i] - h;
          }
        }
        f = f + h;
        /* ql transformation */
        p = d[mm];
        c = 1.0;
        c2 = c;
        el1 = e[l1];
        s = 0.0;
        mml = mm - l;
        for (ii = 0; ii < mml; ii++) {
          c3 = c2;
          c2 = c;
          s2 = s;
          i = mm - ii - 1;
          g = c * e[i];
          h = c * p;
          r = sqrt(p * p + e[i] * e[i]);
          e[i + 1] = s * r;
          s = e[i] / r;
          c = p / r;
          p = c * d[i] - s * g;
          d[i + 1] = h + s * (c * g + s * d[i]);
          /* form vector */
          for (k = 0; k < 3; k++) {
            h = ref_matrix_vec(d, k, i + 1);
            ref_matrix_vec(d, k, i + 1) = s * ref_matrix_vec(d, k, i) + c * h;
            ref_matrix_vec(d, k, i) = c * ref_matrix_vec(d, k, i) - s * h;
          }
        }
        p = -s * s2 * c3 * el1 * e[l] / dl1;
        e[l] = s * p;
        d[l] = c * p;
        tst2 = tst1 + ABS(e[l]);
        if (ABS(tst2 - tst1) < 1.0e-14) break;
      } while (REF_TRUE); /* iterate */
    }                     /* l_not_equal_mm */
    d[l] = d[l] + f;
  } /* row_loop */

  return REF_SUCCESS;
}